

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleClock.hpp
# Opt level: O0

uint16_t __thiscall Apple::Clock::ClockStorage::perform(ClockStorage *this,uint8_t command)

{
  byte *pbVar1;
  reference pvVar2;
  reference pvVar3;
  Phase PVar4;
  uint uVar5;
  byte local_2d;
  uint8_t command_local;
  ClockStorage *this_local;
  
  PVar4 = this->phase_;
  if (PVar4 == Command) {
    if ((command & 0x70) == 0) {
      this->address_ = ((int)(uint)command >> 2 & 3U) + 0x100;
    }
    else if ((command & 0x70) == 0x20) {
      this->address_ = ((int)(uint)command >> 2 & 3U) + 0x10;
    }
    else if ((command & 0x70) == 0x30) {
      if ((command & 8) != 0) {
        this->address_ = (command & 7) << 5;
        PVar4 = SecondAddressByteWrite;
        if ((command & 0x80) != 0) {
          PVar4 = SecondAddressByteRead;
        }
        this->phase_ = PVar4;
        return 0x100;
      }
      uVar5 = 0x200;
      if ((command & 4) != 0) {
        uVar5 = 0x201;
      }
      this->address_ = uVar5;
    }
    else {
      if ((command & 0x40) == 0) {
        return 0x101;
      }
      this->address_ = (int)(uint)command >> 2 & 0xf;
    }
    if ((command & 0x80) == 0) {
      this->phase_ = WriteData;
      this_local._6_2_ = 0x100;
    }
    else if ((this->address_ == 0x200) || (this->address_ == 0x201)) {
      this_local._6_2_ = 0x101;
    }
    else {
      if (this->address_ < 0x100) {
        pbVar1 = std::array<unsigned_char,_256UL>::operator[](&this->data_,(ulong)this->address_);
        local_2d = *pbVar1;
      }
      else {
        pbVar1 = std::array<unsigned_char,_4UL>::operator[]
                           (&this->seconds_,(ulong)(this->address_ & 0xff));
        local_2d = *pbVar1;
      }
      this_local._6_2_ = (ushort)local_2d;
    }
    return this_local._6_2_;
  }
  if (1 < PVar4 - SecondAddressByteRead) {
    if (PVar4 != WriteData) {
      return 0x100;
    }
    if (this->address_ == 0x201) {
      this->write_protect_ = command;
      return 0x101;
    }
    if (this->address_ == 0x200) {
      return 0x101;
    }
    if ((this->write_protect_ & 0x80) == 0) {
      if (this->address_ < 0x100) {
        pvVar3 = std::array<unsigned_char,_256UL>::operator[](&this->data_,(ulong)this->address_);
        *pvVar3 = command;
      }
      else {
        pvVar2 = std::array<unsigned_char,_4UL>::operator[]
                           (&this->seconds_,(ulong)(this->address_ & 0xff));
        *pvVar2 = command;
      }
    }
    this->phase_ = Command;
    return 0x101;
  }
  if ((command & 0x83) != 0) {
    return 0x101;
  }
  this->address_ = (int)(uint)command >> 2 | this->address_;
  if (this->phase_ == SecondAddressByteRead) {
    this->phase_ = Command;
    pbVar1 = std::array<unsigned_char,_256UL>::operator[](&this->data_,(ulong)this->address_);
    return (ushort)*pbVar1;
  }
  this->phase_ = WriteData;
  return 0x100;
}

Assistant:

uint16_t perform(uint8_t command) {
			/*
				Documented commands:

					z0000001		Seconds register 0 (lowest order byte)
					z0000101		Seconds register 1
					z0001001		Seconds register 2
					z0001101		Seconds register 3
					00110001		Test register (write only)
					00110101		Write-protect register (write only)
					z010aa01		RAM addresses 0x10 - 0x13
					z1aaaa01		RAM addresses 0x00 – 0x0f

					z0111abc, followed by 0defgh00
									RAM address abcdefgh

					z = 1 => a read; z = 0 => a write.

				The top bit of the write-protect register enables (0) or disables (1)
				writes to other locations.

				All the documentation says about the test register is to set the top
				two bits to 0 for normal operation. Abnormal operation is undefined.
			*/
			switch(phase_) {
				case Phase::Command:
					// Decode an address.
					switch(command & 0x70) {
						default:
							if(command & 0x40) {
								// RAM addresses 0x00 – 0x0f.
								address_ = (command >> 2) & 0xf;
							} else return DidComplete;	// Unrecognised.
						break;

						case 0x00:
							// A time access.
							address_ = SecondsBuffer + ((command >> 2)&3);
						break;
						case 0x30:
							// Either a register access or an extended instruction.
							if(command & 0x08) {
								address_ = unsigned((command & 0x7) << 5);
								phase_ = (command & 0x80) ? Phase::SecondAddressByteRead : Phase::SecondAddressByteWrite;
								return NoResult;
							} else {
								address_ = (command & 4) ? RegisterWriteProtect : RegisterTest;
							}
						break;
						case 0x20:
							// RAM addresses 0x10 – 0x13.
							address_ = 0x10 + ((command >> 2) & 0x3);
						break;
					}

					// If this is a read, return a result; otherwise prepare to write.
					if(command & 0x80) {
						// The two registers are write-only.
						if(address_ == RegisterTest || address_ == RegisterWriteProtect) {
							return DidComplete;
						}
						return (address_ >= SecondsBuffer) ? seconds_[address_ & 0xff] : data_[address_];
					}
					phase_ = Phase::WriteData;
				return NoResult;

				case Phase::SecondAddressByteRead:
				case Phase::SecondAddressByteWrite:
					if(command & 0x83) {
						return DidComplete;
					}
					address_ |= command >> 2;

					if(phase_ == Phase::SecondAddressByteRead) {
						phase_ = Phase::Command;
						return data_[address_];	// Only RAM accesses can get this far.
					} else {
						phase_ = Phase::WriteData;
					}
				return NoResult;

				case Phase::WriteData:
					// First test: is this to the write-protect register?
					if(address_ == RegisterWriteProtect) {
						write_protect_ = command;
						return DidComplete;
					}

					if(address_ == RegisterTest) {
						// No documentation here.
						return DidComplete;
					}

					// No other writing is permitted if the write protect
					// register won't allow it.
					if(!(write_protect_ & 0x80)) {
						if(address_ >= SecondsBuffer) {
							seconds_[address_ & 0xff] = command;
						} else {
							data_[address_] = command;
						}
					}

					phase_ = Phase::Command;
				return DidComplete;
			}

			return NoResult;
		}